

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O2

bool addAssemblerLabel(wstring *labelName)

{
  bool bVar1;
  CAssemblerLabel *this;
  u64 RamPos;
  
  bVar1 = SymbolTable::isValidSymbolName(labelName);
  if (bVar1) {
    this = (CAssemblerLabel *)operator_new(0x48);
    RamPos = FileManager::getVirtualAddress(g_fileManager);
    CAssemblerLabel::CAssemblerLabel(this,labelName,RamPos,Global.Section,false);
    AddAssemblerCommand((CAssemblerCommand *)0x13c9ac);
  }
  else {
    Logger::printError<std::__cxx11::wstring>(Error,L"Invalid label name \"%s\"",labelName);
  }
  return bVar1;
}

Assistant:

bool addAssemblerLabel(const std::wstring& labelName)
{
	if (checkValidLabelName(labelName) == false)
	{
		Logger::printError(Logger::Error,L"Invalid label name \"%s\"",labelName);
		return false;
	}

	CAssemblerLabel* Label = new CAssemblerLabel(labelName,g_fileManager->getVirtualAddress(),Global.Section,false);
	AddAssemblerCommand(Label);
	return true;
}